

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sx1231_ods.c
# Opt level: O3

int rf_open(rf_dev_t *dev,char *spi_path)

{
  uint8_t *data;
  int iVar1;
  int iVar2;
  undefined8 in_RAX;
  int *piVar3;
  uint8_t val;
  byte local_21;
  
  local_21 = (byte)((ulong)in_RAX >> 0x38);
  iVar2 = open(spi_path,2);
  if (iVar2 == -1) {
    iVar2 = 0x10010001;
  }
  else {
    dev->fd = iVar2;
    iVar2 = spi_read_reg(iVar2,'\x10',&local_21);
    if ((iVar2 == 0) && (iVar2 = 0x20001, (local_21 & 0xf0) == 0x20)) {
      data = &dev->fifo_thresh;
      iVar2 = spi_read_reg(dev->fd,'<',data);
      if (iVar2 == 0) {
        *data = *data & 0x7f;
        return 0;
      }
    }
    piVar3 = __errno_location();
    iVar1 = *piVar3;
    close(dev->fd);
    dev->fd = -1;
    *piVar3 = iVar1;
  }
  return iVar2;
}

Assistant:

int rf_open(rf_dev_t *dev, const char *spi_path)
{
	int err = ERR_UNSPEC;
	int fd;
	uint8_t val;

	fd = open(spi_path, O_RDWR);
	if (fd == -1) {
		return ERR_SPI_OPEN_DEV;
	}

	dev->fd = fd;

	// Check device version
	TRY(spi_read_reg(dev->fd, RegVersion, &val));
	if ((val & SX1231_VERSION_MASK) != SX1231_VERSION) {
		err = ERR_RFM_CHIP_VERSION;
		goto fail;
	}

	// Read config
	TRY(_sync_config(dev));

	return ERR_OK;
fail:
	SAVE_ERRNO(rf_close(dev));
	return err;
}